

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O1

int TIFFWriteDirectoryTagRationalArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,float *value)

{
  int iVar1;
  uint32_t *lp;
  long lVar2;
  uint32_t *num;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    iVar1 = 1;
  }
  else {
    lp = (uint32_t *)_TIFFmallocExt(tif,(ulong)(count * 2) * 4);
    if (lp == (uint32_t *)0x0) {
      iVar1 = 0;
      TIFFErrorExtR(tif,"TIFFWriteDirectoryTagCheckedRationalArray","Out of memory");
    }
    else {
      if (count != 0) {
        lVar2 = 0;
        num = lp;
        do {
          DoubleToRational((double)value[lVar2],num,num + 1);
          lVar2 = lVar2 + 1;
          num = num + 2;
        } while (count != (uint32_t)lVar2);
      }
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabArrayOfLong(lp,(ulong)(count * 2));
      }
      iVar1 = TIFFWriteDirectoryTagData(tif,ndir,dir,tag,5,count,count * 8,lp);
      _TIFFfreeExt(tif,lp);
    }
  }
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagRationalArray(TIFF *tif, uint32_t *ndir,
                                              TIFFDirEntry *dir, uint16_t tag,
                                              uint32_t count, float *value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedRationalArray(tif, ndir, dir, tag,
                                                      count, value));
}